

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O1

void __thiscall
ParticleArrayTest_Back_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>::TestBody
          (ParticleArrayTest_Back_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>
           *this)

{
  void *pvVar1;
  Particle<(pica::Dimension)2> particle_00;
  Particle<(pica::Dimension)2> a;
  Particle<(pica::Dimension)2> a_00;
  ParticleRef b;
  bool bVar2;
  uint uVar3;
  long lVar4;
  PositionType minPosition;
  PositionType maxPosition;
  ConstParticleRef b_00;
  AssertionResult gtest_ar__1;
  ParticleType particle;
  ParticleArray particlesCopy;
  AssertHelper local_248;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240 [2];
  AssertionResult local_230;
  ulong local_220;
  AssertHelper local_218;
  Particle local_210;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *local_1d0;
  int iStack_1c8;
  undefined4 uStack_1c4;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *local_1c0;
  int iStack_1b8;
  undefined4 uStack_1b4;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> local_1b0;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> local_f0;
  
  local_220 = 0;
  memset(&local_f0,0,0xc0);
  do {
    minPosition.y = -10.0;
    minPosition.x = -10.0;
    maxPosition.y = 10.0;
    maxPosition.x = 10.0;
    BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
              (&local_210,(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this,
               minPosition,maxPosition);
    particle_00.position.y = local_210.position.y;
    particle_00.position.x = local_210.position.x;
    particle_00.p.x = local_210.p.x;
    particle_00.p.y = local_210.p.y;
    particle_00.p.z = local_210.p.z;
    particle_00.factor = local_210.factor;
    particle_00.invGamma = local_210.invGamma;
    particle_00.typeIndex = local_210.typeIndex;
    particle_00._58_6_ = local_210._58_6_;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::
    pushBack<pica::Particle<(pica::Dimension)2>>
              ((ParticleArraySoA<pica::Particle<(pica::Dimension)2>> *)&local_f0,particle_00);
    iStack_1c8 = (int)((ulong)((long)local_f0.typeIndex.
                                     super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)local_f0.typeIndex.
                                    super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 1) + -1;
    b.super_ConstParticleRef._12_4_ = uStack_1c4;
    b.super_ConstParticleRef.idx = iStack_1c8;
    b._28_4_ = uStack_1b4;
    b.idx = iStack_1c8;
    a.position.y = local_210.position.y;
    a.position.x = local_210.position.x;
    a.p.x = local_210.p.x;
    a.p.y = local_210.p.y;
    a.p.z = local_210.p.z;
    a.factor = local_210.factor;
    a.invGamma = local_210.invGamma;
    a.typeIndex = local_210.typeIndex;
    a._58_6_ = local_210._58_6_;
    b.super_ConstParticleRef.particles = &local_f0;
    b.particles = &local_f0;
    local_1d0 = &local_f0;
    local_1c0 = &local_f0;
    iStack_1b8 = iStack_1c8;
    local_1b0.positions[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
         eqParticles_<pica::Particle<(pica::Dimension)2>,pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::ParticleRef>
                   ((BaseParticleFixture<pica::Particle<(pica::Dimension)2>> *)this,a,b);
    local_1b0.positions[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (!(bool)local_1b0.positions[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start._0_1_) {
      testing::Message::Message((Message *)local_240);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)&local_230,(AssertionResult *)&local_1b0,
                 "this->eqParticles_(particle, particles.back())","false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_248,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                 ,0x67,(char *)CONCAT71(local_230._1_7_,local_230.success_));
      testing::internal::AssertHelper::operator=(&local_248,(Message *)local_240);
      testing::internal::AssertHelper::~AssertHelper(&local_248);
      if ((void *)CONCAT71(local_230._1_7_,local_230.success_) != (void *)0x0) {
        operator_delete__((void *)CONCAT71(local_230._1_7_,local_230.success_));
      }
      if (local_240[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_240[0].ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_240[0].ptr_ + 8))();
        }
        local_240[0].ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1b0.positions[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ParticleArraySoA
              (&local_1b0,&local_f0);
    b_00.idx = (int)((ulong)((long)local_1b0.typeIndex.
                                   super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)local_1b0.typeIndex.
                                  super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 1) + -1;
    a_00.position.y = local_210.position.y;
    a_00.position.x = local_210.position.x;
    a_00.p.x = local_210.p.x;
    a_00.p.y = local_210.p.y;
    a_00.p.z = local_210.p.z;
    a_00.factor = local_210.factor;
    a_00.invGamma = local_210.invGamma;
    a_00.typeIndex = local_210.typeIndex;
    a_00._58_6_ = local_210._58_6_;
    b_00.particles = &local_1b0;
    b_00._12_4_ = 0;
    local_230.success_ =
         BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
         eqParticles_<pica::Particle<(pica::Dimension)2>,pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::ConstParticleRef>
                   ((BaseParticleFixture<pica::Particle<(pica::Dimension)2>> *)this,a_00,b_00);
    local_230.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!local_230.success_) {
      testing::Message::Message((Message *)&local_248);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)local_240,&local_230,
                 "this->eqParticles_(particle, particlesCopy.back())","false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_218,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                 ,0x69,(char *)local_240[0].ptr_);
      testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_248);
      testing::internal::AssertHelper::~AssertHelper(&local_218);
      if (local_240[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete__(local_240[0].ptr_);
      }
      if (local_248.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_248.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_248.data_ + 8))();
        }
        local_248.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_230.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_1b0.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b0.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1b0.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b0.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1b0.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b0.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1b0.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b0.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1b0.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b0.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1b0.factors.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b0.factors.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    lVar4 = 0x70;
    do {
      pvVar1 = *(void **)((long)&local_1c0 + lVar4);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,*(long *)((long)&local_1b0.positions[0].
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start + lVar4) -
                               (long)pvVar1);
      }
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != 0x28);
    lVar4 = 0x30;
    do {
      pvVar1 = *(void **)((long)&iStack_1c8 + lVar4);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,*(long *)((long)&iStack_1b8 + lVar4) - (long)pvVar1);
      }
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != 0);
    uVar3 = (int)local_220 + 1;
    local_220 = (ulong)uVar3;
  } while (uVar3 != 0xd);
  if (local_f0.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar4 = 0x70;
  do {
    pvVar1 = *(void **)((long)&(((vector<short,_std::allocator<short>_> *)(local_1b0.ps + 5))->
                               super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                               super__Vector_impl_data._M_finish + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_f0.positions[0].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start + lVar4) -
                             (long)pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != 0x28);
  lVar4 = 0x30;
  do {
    pvVar1 = *(void **)((long)&(((vector<short,_std::allocator<short>_> *)(local_1b0.ps + 5))->
                               super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_f0.positions + lVar4 + -8) - (long)pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != 0);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Back)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    for (int i = 0; i < 13; i++) {
        ParticleType particle = this->randomParticle();
        particles.pushBack(particle);
        EXPECT_TRUE(this->eqParticles_(particle, particles.back()));
        const ParticleArray particlesCopy = particles;
        EXPECT_TRUE(this->eqParticles_(particle, particlesCopy.back()));
    }
}